

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O3

void __thiscall icu_63::VTimeZone::VTimeZone(VTimeZone *this,VTimeZone *source)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  UVector *pUVar3;
  long *plVar4;
  void *obj;
  UnicodeString *that;
  int index;
  UErrorCode status;
  UErrorCode local_4c;
  UnicodeString *local_48;
  UnicodeString *local_40;
  UnicodeString *local_38;
  
  BasicTimeZone::BasicTimeZone(&this->super_BasicTimeZone,&source->super_BasicTimeZone);
  (this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject =
       (_func_int **)&PTR__VTimeZone_003d3240;
  this->tz = (BasicTimeZone *)0x0;
  this->vtzlines = (UVector *)0x0;
  UnicodeString::UnicodeString(&this->tzurl,&source->tzurl);
  this->lastmod = source->lastmod;
  UnicodeString::UnicodeString(&this->olsonzid,&source->olsonzid);
  that = &source->icutzver;
  UnicodeString::UnicodeString(&this->icutzver,that);
  if (source->tz != (BasicTimeZone *)0x0) {
    iVar2 = (*(source->tz->super_TimeZone).super_UObject._vptr_UObject[0xc])();
    this->tz = (BasicTimeZone *)CONCAT44(extraout_var,iVar2);
  }
  if (source->vtzlines != (UVector *)0x0) {
    local_4c = U_ZERO_ERROR;
    iVar2 = source->vtzlines->count;
    local_40 = &this->olsonzid;
    local_38 = &this->icutzver;
    pUVar3 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)that);
    if (pUVar3 == (UVector *)0x0) {
      bVar1 = true;
    }
    else {
      UVector::UVector(pUVar3,uprv_deleteUObject_63,uhash_compareUnicodeString_63,iVar2,&local_4c);
      bVar1 = local_4c < U_ILLEGAL_ARGUMENT_ERROR;
    }
    this->vtzlines = pUVar3;
    if ((bool)(0 < iVar2 & bVar1)) {
      index = 0;
      local_48 = &this->tzurl;
      do {
        plVar4 = (long *)UVector::elementAt(source->vtzlines,index);
        pUVar3 = this->vtzlines;
        obj = (void *)(**(code **)(*plVar4 + 0x38))(plVar4);
        UVector::addElement(pUVar3,obj,&local_4c);
        if (U_ZERO_ERROR < local_4c) goto LAB_002081c4;
        index = index + 1;
      } while (iVar2 != index);
    }
    else if (!bVar1) {
LAB_002081c4:
      if (this->vtzlines != (UVector *)0x0) {
        (*(this->vtzlines->super_UObject)._vptr_UObject[1])();
      }
    }
  }
  return;
}

Assistant:

VTimeZone::VTimeZone(const VTimeZone& source)
:   BasicTimeZone(source), tz(NULL), vtzlines(NULL),
    tzurl(source.tzurl), lastmod(source.lastmod),
    olsonzid(source.olsonzid), icutzver(source.icutzver) {
    if (source.tz != NULL) {
        tz = (BasicTimeZone*)source.tz->clone();
    }
    if (source.vtzlines != NULL) {
        UErrorCode status = U_ZERO_ERROR;
        int32_t size = source.vtzlines->size();
        vtzlines = new UVector(uprv_deleteUObject, uhash_compareUnicodeString, size, status);
        if (U_SUCCESS(status)) {
            for (int32_t i = 0; i < size; i++) {
                UnicodeString *line = (UnicodeString*)source.vtzlines->elementAt(i);
                vtzlines->addElement(line->clone(), status);
                if (U_FAILURE(status)) {
                    break;
                }
            }
        }
        if (U_FAILURE(status) && vtzlines != NULL) {
            delete vtzlines;
        }
    }
}